

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocketaddress.c
# Opt level: O0

pboolean p_socket_address_is_loopback(PSocketAddress *addr)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  bool local_2e;
  in6_addr *__a;
  puint32 addr4;
  PSocketAddress *addr_local;
  
  bVar3 = true;
  if (addr != (PSocketAddress *)0x0) {
    bVar3 = addr->family == P_SOCKET_FAMILY_UNKNOWN;
  }
  if (bVar3) {
    addr_local._4_4_ = 0;
  }
  else if (addr->family == P_SOCKET_FAMILY_INET) {
    addr_local._4_4_ = (uint)(((addr->addr).sin_addr.s_addr & 0xff) == 0x7f);
  }
  else {
    local_2e = false;
    if ((((addr->addr).sin_addr.s_addr == 0) &&
        (local_2e = false, *(int *)((long)&addr->addr + 4) == 0)) &&
       (local_2e = false, *(int *)((long)&addr->addr + 8) == 0)) {
      uVar1 = *(uint32_t *)((long)&addr->addr + 0xc);
      uVar2 = htonl(1);
      local_2e = uVar1 == uVar2;
    }
    addr_local._4_4_ = (uint)local_2e;
  }
  return addr_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_socket_address_is_loopback (const PSocketAddress *addr)
{
	puint32 addr4;

	if (P_UNLIKELY (addr == NULL || addr->family == P_SOCKET_FAMILY_UNKNOWN))
		return FALSE;

	if (addr->family == P_SOCKET_FAMILY_INET) {
		addr4 = p_ntohl (* ((puint32 *) &addr->addr.sin_addr));

		/* 127.0.0.0/8 */
		return ((addr4 & 0xff000000) == 0x7f000000);
	}
#ifdef AF_INET6
	else
		return IN6_IS_ADDR_LOOPBACK (&addr->addr.sin6_addr);
#else
	else
		return FALSE;
#endif
}